

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O3

bool __thiscall Clasp::SatBuilder::doEndProgram(SatBuilder *this)

{
  pointer pLVar1;
  byte bVar2;
  byte bVar3;
  uint32 uVar4;
  Share SVar5;
  SharedContext *pSVar6;
  pointer pVVar7;
  bool bVar8;
  ulong uVar9;
  uint v;
  pointer pLVar10;
  LitVec *pLVar11;
  Result RVar12;
  Literal relax;
  LitVec cc;
  Literal local_5c;
  iterator local_58;
  ulong uStack_50;
  Fill<Clasp::Literal> local_40;
  LitVec *local_38;
  
  bVar8 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  if ((bVar8) && ((this->softClauses_).ebo_.size != 0)) {
    pLVar11 = &this->softClauses_;
    SharedContext::setPreproMode((this->super_ProgramBuilder).ctx_,1,true);
    pSVar6 = (this->super_ProgramBuilder).ctx_;
    SharedContext::addVars(pSVar6,(this->vars_ - (pSVar6->varInfo_).ebo_.size) + 1,Atom,' ');
    SharedContext::startAddConstraints((this->super_ProgramBuilder).ctx_,100);
    local_58 = (iterator)0x0;
    uStack_50 = 0;
    pLVar10 = (this->softClauses_).ebo_.buf;
    uVar9 = (ulong)(this->softClauses_).ebo_.size;
    if (uVar9 == 0) {
      bVar8 = true;
    }
    else {
      pLVar1 = pLVar10 + uVar9;
      local_38 = pLVar11;
      do {
        uVar4 = pLVar10->rep_;
        local_5c.rep_ = pLVar10[1].rep_;
        bVar8 = true;
        if ((local_5c.rep_ & 1) == 0) {
          uStack_50 = uStack_50 & 0xffffffff00000000;
          local_40.val_ = &local_5c;
          bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
          insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::Literal>>
                    ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)&local_58,local_58
                     ,1,&local_40);
          do {
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)&local_58,
                       pLVar10 + 2);
            pLVar10 = pLVar10 + 1;
          } while ((local_58[(int)uStack_50 - 1U].rep_ & 1) == 0);
          local_58[(int)uStack_50 - 1U].rep_ = local_58[(int)uStack_50 - 1U].rep_ & 0xfffffffe;
          local_40.val_ = (Literal *)((ulong)local_40.val_ & 0xffffffff00000000);
          RVar12 = ClauseCreator::create
                             (*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,
                              (LitVec *)&local_58,0,(ConstraintInfo *)&local_40);
          bVar8 = ((undefined1  [16])RVar12 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
        }
        uVar9 = CONCAT44(uVar4,local_5c.rep_);
        local_5c.rep_ = local_5c.rep_ & 0xfffffffe;
        SharedContext::addMinimize
                  ((this->super_ProgramBuilder).ctx_,(WeightLiteral)(uVar9 & 0xfffffffffffffffe),0);
        pLVar10 = pLVar10 + 2;
      } while ((bool)(pLVar10 != pLVar1 & bVar8));
      pLVar10 = (local_38->ebo_).buf;
      pLVar11 = local_38;
    }
    (pLVar11->ebo_).buf = (pointer)0x0;
    (pLVar11->ebo_).size = 0;
    (pLVar11->ebo_).cap = 0;
    if (pLVar10 != (pointer)0x0) {
      operator_delete(pLVar10);
    }
    if (local_58 != (iterator)0x0) {
      operator_delete(local_58);
    }
    if (bVar8) {
LAB_0015cf3a:
      if ((this->varState_).ebo_.size != 1) {
        SVar5 = ((this->super_ProgramBuilder).ctx_)->share_;
        v = 1;
        do {
          bVar2 = (this->varState_).ebo_.buf[v];
          if ((~bVar2 & 0xc) != 0) {
            if (bVar2 == 0) {
              if (((uint)SVar5 >> 0x1b & 1) == 0) {
                SharedContext::eliminate((this->super_ProgramBuilder).ctx_,v);
              }
            }
            else {
              pSVar6 = (this->super_ProgramBuilder).ctx_;
              pVVar7 = (pSVar6->varInfo_).ebo_.buf;
              bVar3 = pVVar7[v].rep;
              if ((bVar3 & 0x20) != 0) {
                pVVar7[v].rep = bVar3 & 0xdf;
              }
              Solver::setPref(*(pSVar6->solvers_).ebo_.buf,v,def_value,bVar2 >> 2);
            }
          }
          v = v + 1;
        } while (v != (this->varState_).ebo_.size);
      }
      ProgramBuilder::markOutputVariables(&this->super_ProgramBuilder);
      return true;
    }
  }
  else if (bVar8) goto LAB_0015cf3a;
  return false;
}

Assistant:

bool SatBuilder::doEndProgram() {
	bool ok = ctx()->ok();
	if (!softClauses_.empty() && ok) {
		ctx()->setPreserveModels(true);
		uint32 softVars = vars_ - ctx()->numVars();
		ctx()->addVars(softVars, Var_t::Atom, VarInfo::Nant);
		ctx()->startAddConstraints();
		LitVec cc;
		for (LitVec::const_iterator it = softClauses_.begin(), end = softClauses_.end(); it != end && ok; ++it) {
			weight_t w     = (weight_t)it->rep();
			Literal  relax = *++it;
			if (!relax.flagged()) {
				cc.assign(1, relax);
				do { cc.push_back(*++it); } while (!cc.back().flagged());
				cc.back().unflag();
				ok = ClauseCreator::create(*ctx()->master(), cc, Constraint_t::Static).ok();
			}
			addMinLit(0, WeightLiteral(relax.unflag(), w));
		}
		LitVec().swap(softClauses_);
	}
	if (ok) {
		const uint32 seen = 12;
		const bool   elim = !ctx()->preserveModels();
		for (Var v = 1; v != (Var)varState_.size() && ok; ++v) {
			uint32 m = varState_[v];
			if ( (m & seen) != seen ) {
				if      (m)   { ctx()->setNant(v, false); ctx()->master()->setPref(v, ValueSet::def_value, ValueRep(m >> 2)); }
				else if (elim){ ctx()->eliminate(v); }
			}
		}
		markOutputVariables();
	}
	return ok;
}